

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

void PHYSFS_setErrorCode(PHYSFS_ErrorCode errcode)

{
  void *pvVar1;
  ErrState *local_18;
  ErrState *err;
  PHYSFS_ErrorCode errcode_local;
  
  if (errcode != PHYSFS_ERR_OK) {
    local_18 = findErrorForCurrentThread();
    if (local_18 == (ErrState *)0x0) {
      local_18 = (ErrState *)(*__PHYSFS_AllocatorHooks.Malloc)(0x18);
      if (local_18 == (ErrState *)0x0) {
        return;
      }
      memset(local_18,0,0x18);
      pvVar1 = __PHYSFS_platformGetThreadID();
      local_18->tid = pvVar1;
      if (errorLock != (void *)0x0) {
        __PHYSFS_platformGrabMutex(errorLock);
      }
      local_18->next = errorStates;
      errorStates = local_18;
      if (errorLock != (void *)0x0) {
        __PHYSFS_platformReleaseMutex(errorLock);
      }
    }
    local_18->code = errcode;
  }
  return;
}

Assistant:

void PHYSFS_setErrorCode(PHYSFS_ErrorCode errcode)
{
    ErrState *err;

    if (!errcode)
        return;

    err = findErrorForCurrentThread();
    if (err == NULL)
    {
        err = (ErrState *) allocator.Malloc(sizeof (ErrState));
        if (err == NULL)
            return;   /* uhh...? */

        memset(err, '\0', sizeof (ErrState));
        err->tid = __PHYSFS_platformGetThreadID();

        if (errorLock != NULL)
            __PHYSFS_platformGrabMutex(errorLock);

        err->next = errorStates;
        errorStates = err;

        if (errorLock != NULL)
            __PHYSFS_platformReleaseMutex(errorLock);
    } /* if */

    err->code = errcode;
}